

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O1

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::MutableMessage
          (ExtensionSet *this,FieldDescriptor *descriptor,MessageFactory *factory)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  Descriptor *pDVar4;
  undefined4 extraout_var;
  int64 iVar5;
  undefined4 extraout_var_00;
  MessageLite *pMVar6;
  Extension *extension;
  Extension *local_30;
  FieldDescriptor *local_28;
  _func_void_FieldDescriptor_ptr *local_20;
  undefined4 extraout_var_01;
  
  bVar2 = MaybeNewExtension(this,*(int *)(descriptor + 0x44),descriptor,&local_30);
  if (bVar2) {
    if (*(once_flag **)(descriptor + 0x30) != (once_flag *)0x0) {
      local_20 = FieldDescriptor::TypeOnceInit;
      local_28 = descriptor;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(descriptor + 0x30),&local_20,&local_28);
    }
    local_30->type = (FieldType)descriptor[0x38];
    local_30->is_repeated = false;
    local_30->is_packed = false;
    pDVar4 = FieldDescriptor::message_type(descriptor);
    iVar3 = (*factory->_vptr_MessageFactory[2])(factory,pDVar4);
    local_30->field_0xa = local_30->field_0xa & 0xf;
    iVar5 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x20))
                      ((long *)CONCAT44(extraout_var,iVar3),this->arena_);
    (local_30->field_0).int64_value = iVar5;
    local_30->field_0xa = local_30->field_0xa & 0xf0;
    pMVar6 = (MessageLite *)(local_30->field_0).int64_value;
  }
  else {
    bVar1 = local_30->field_0xa;
    local_30->field_0xa = bVar1 & 0xf0;
    pMVar6 = (local_30->field_0).message_value;
    if ((bVar1 & 0x10) != 0) {
      pDVar4 = FieldDescriptor::message_type(descriptor);
      iVar3 = (*factory->_vptr_MessageFactory[2])(factory,pDVar4);
      iVar3 = (*pMVar6->_vptr_MessageLite[4])(pMVar6,CONCAT44(extraout_var_00,iVar3));
      pMVar6 = (MessageLite *)CONCAT44(extraout_var_01,iVar3);
    }
  }
  return pMVar6;
}

Assistant:

MessageLite* ExtensionSet::MutableMessage(const FieldDescriptor* descriptor,
                                          MessageFactory* factory) {
  Extension* extension;
  if (MaybeNewExtension(descriptor->number(), descriptor, &extension)) {
    extension->type = descriptor->type();
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), FieldDescriptor::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_packed = false;
    const MessageLite* prototype =
        factory->GetPrototype(descriptor->message_type());
    extension->is_lazy = false;
    extension->message_value = prototype->New(arena_);
    extension->is_cleared = false;
    return extension->message_value;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL, MESSAGE);
    extension->is_cleared = false;
    if (extension->is_lazy) {
      return extension->lazymessage_value->MutableMessage(
          *factory->GetPrototype(descriptor->message_type()));
    } else {
      return extension->message_value;
    }
  }
}